

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::VertexInput::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *this_00;
  undefined1 (*pauVar1) [12];
  DeviceInterface *vk;
  VkDevice device;
  _func_int *bufferSize;
  Allocation *pAVar2;
  VkImageSubresourceRange subresourceRange;
  Operation *pOVar3;
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *this_01
  ;
  deUint32 stride;
  Operation *pOVar4;
  Buffer *this_02;
  DescriptorSetLayoutBuilder *this_03;
  DescriptorPoolBuilder *this_04;
  DescriptorSetUpdateBuilder *this_05;
  Image *this_06;
  TextureFormat format;
  GraphicsPipelineBuilder *pGVar5;
  const_iterator cVar6;
  VkDescriptorBufferInfo outputBufferDescriptorInfo;
  Move<vk::Handle<(vk::HandleType)13>_> local_268;
  Move<vk::Handle<(vk::HandleType)18>_> local_248;
  Operation *local_220;
  Operation *local_218;
  Operation *local_210;
  Operation *local_208;
  Operation *local_200;
  Operation *local_1f8;
  Operation *local_1f0;
  OperationContext *local_1e8;
  Operation *local_1e0;
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
  *local_1d8;
  Allocator *local_1d0;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *local_1c8;
  MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  deUint32 local_1a8;
  GraphicsPipelineBuilder local_198;
  key_type local_88;
  key_type local_68;
  deUint64 local_48;
  undefined8 local_40;
  _func_int *local_38;
  
  local_1c0 = __return_storage_ptr__;
  pOVar4 = (Operation *)operator_new(0x180);
  pOVar4->_vptr_Operation = (_func_int **)&PTR__Implementation_00d31110;
  pOVar4[1]._vptr_Operation = (_func_int **)context;
  pOVar4[2]._vptr_Operation = (_func_int **)resource;
  this_00 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             *)(pOVar4 + 3);
  pOVar4[3]._vptr_Operation = (_func_int **)0x0;
  pOVar4[5]._vptr_Operation = (_func_int **)0x0;
  pOVar4[7]._vptr_Operation = (_func_int **)0x0;
  local_210 = pOVar4 + 9;
  local_1f8 = pOVar4 + 0xd;
  local_218 = pOVar4 + 0x11;
  local_1e0 = pOVar4 + 0x15;
  local_1d8 = (UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
               *)(pOVar4 + 0x1a);
  pOVar4[0x1a]._vptr_Operation = (_func_int **)0x0;
  local_1f0 = pOVar4 + 0x1c;
  pOVar4[0x1c]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x1d]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x1e]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x1f]._vptr_Operation = (_func_int **)0x0;
  local_200 = pOVar4 + 0x24;
  local_220 = pOVar4 + 0x28;
  local_208 = pOVar4 + 0x2c;
  pOVar4[9]._vptr_Operation = (_func_int **)0x0;
  pOVar4[10]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0xb]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0xc]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0xd]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0xe]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0xf]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x10]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x11]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x12]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x13]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x14]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x15]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x16]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x17]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x18]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x24]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x25]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x26]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x27]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x28]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x29]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x2a]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x2b]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x2c]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x2d]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x2e]._vptr_Operation = (_func_int **)0x0;
  pOVar4[0x2f]._vptr_Operation = (_func_int **)0x0;
  local_1c8 = this_00;
  requireFeatures(context->m_vki,context->m_physicalDevice,8);
  vk = context->m_vk;
  device = context->m_device;
  local_1d0 = context->m_allocator;
  bufferSize = pOVar4[2]._vptr_Operation[5];
  local_1e8 = context;
  this_02 = (Buffer *)operator_new(0x30);
  makeBufferCreateInfo((VkBufferCreateInfo *)&local_198,(VkDeviceSize)bufferSize,0x20);
  synchronization::Buffer::Buffer
            (this_02,vk,device,local_1d0,(VkBufferCreateInfo *)&local_198,(MemoryRequirement)0x1);
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  if ((this_00->m_data).ptr != this_02) {
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset(this_00);
    (this_00->m_data).ptr = this_02;
  }
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            ((UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_268);
  pAVar2 = (((this_00->m_data).ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memset(pAVar2->m_hostPtr,0,(size_t)bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,
             (VkDeviceSize)bufferSize);
  this_01 = local_1d8;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&local_198);
  this_03 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&local_198,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,
                       1,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_248,this_03,vk,device,0);
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_220->_vptr_Operation != (_func_int **)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(pOVar4 + 0x29),
               (VkDescriptorSetLayout)local_220->_vptr_Operation);
  }
  local_220[2]._vptr_Operation =
       (_func_int **)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_220[3]._vptr_Operation =
       (_func_int **)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_220->_vptr_Operation =
       (_func_int **)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_220[1]._vptr_Operation =
       (_func_int **)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  if (local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)
               &local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkDescriptorSetLayout)
               local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_198.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
      .m_deviceIface != (DeviceInterface *)0x0) {
    operator_delete(local_198.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter.m_deviceIface,
                    (long)local_198.m_fragmentShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
                    - (long)local_198.m_fragmentShaderModule.
                            super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                            m_deviceIface);
  }
  if (local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_device != (VkDevice)0x0) {
    operator_delete(local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter.m_device,
                    local_198.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.object.m_internal -
                    (long)local_198.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device);
  }
  if (local_198.m_renderSize.m_data != (int  [2])0x0) {
    operator_delete((void *)local_198.m_renderSize.m_data,
                    (long)local_198.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                          m_deviceIface - (long)local_198.m_renderSize.m_data);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_248);
  this_04 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_248,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_268,this_04,vk,device,1,1);
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_198.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_198.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_200->_vptr_Operation != (_func_int **)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(pOVar4 + 0x25),
               (VkDescriptorPool)local_200->_vptr_Operation);
  }
  local_200[2]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_200[3]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_200->_vptr_Operation = (_func_int **)local_198.m_renderSize.m_data;
  local_200[1]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  if (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)
               &local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkDescriptorPool)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._0_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((_func_int **)
      local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal !=
      (_func_int **)0x0) {
    operator_delete((void *)local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                            m_internal,
                    (long)local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                          m_device -
                    local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                    m_internal);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_268,vk,device,
                    (VkDescriptorPool)local_200->_vptr_Operation,
                    (VkDescriptorSetLayout)local_220->_vptr_Operation);
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface._0_4_ =
       SUB84(local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device,0);
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface._4_4_ =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device._4_4_;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_198.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_198.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._0_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_208->_vptr_Operation != (_func_int **)0x0) {
    local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         (deUint64)local_208->_vptr_Operation;
    (**(code **)(*pOVar4[0x2d]._vptr_Operation + 0x1e8))
              (pOVar4[0x2d]._vptr_Operation,pOVar4[0x2e]._vptr_Operation,
               pOVar4[0x2f]._vptr_Operation,1);
  }
  *(undefined4 *)&local_208[2]._vptr_Operation =
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface._0_4_;
  *(undefined4 *)((long)&local_208[2]._vptr_Operation + 4) =
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface._4_4_;
  *(undefined4 *)&local_208[3]._vptr_Operation =
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device._0_4_;
  *(undefined4 *)((long)&local_208[3]._vptr_Operation + 4) =
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device._4_4_;
  *(int *)&local_208->_vptr_Operation = local_198.m_renderSize.m_data[0];
  *(int *)((long)&local_208->_vptr_Operation + 4) = local_198.m_renderSize.m_data[1];
  *(undefined4 *)&local_208[1]._vptr_Operation =
       (undefined4)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  *(undefined4 *)((long)&local_208[1]._vptr_Operation + 4) =
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  if ((int  [2])local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal !=
      (int  [2])0x0) {
    local_198.m_renderSize.m_data[0] =
         (undefined4)
         local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    local_198.m_renderSize.m_data[1] =
         local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
    (*(local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x3d])
              (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
               ,local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device,
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator,1
              );
  }
  local_48 = (((this_00->m_data).ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
             m_data.object.m_internal;
  local_40 = 0;
  local_38 = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_198);
  this_05 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&local_198,(int)local_208->_vptr_Operation,
                       (void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_05,vk,device);
  if (local_198.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
      .m_deviceIface != (DeviceInterface *)0x0) {
    operator_delete(local_198.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter.m_deviceIface,
                    (long)local_198.m_fragmentShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
                    - (long)local_198.m_fragmentShaderModule.
                            super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                            m_deviceIface);
  }
  if ((VkAllocationCallbacks *)
      local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_device != (VkAllocationCallbacks *)0x0) {
    operator_delete(local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter.m_device,
                    local_198.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.object.m_internal -
                    (long)local_198.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&local_198);
  *(undefined4 *)&pOVar4[0x19]._vptr_Operation = 0x25;
  pOVar4[0x23]._vptr_Operation = (_func_int **)0x100000000;
  pOVar4[0x20]._vptr_Operation = (_func_int **)0x1000000010;
  pOVar4[0x21]._vptr_Operation = (_func_int **)0x100000001;
  pOVar4[0x22]._vptr_Operation = (_func_int **)0x100000000;
  this_06 = (Image *)operator_new(0x30);
  makeImageCreateInfo((VkImageCreateInfo *)&local_198,VK_IMAGE_TYPE_2D,(VkExtent3D *)(pOVar4 + 0x20)
                      ,VK_FORMAT_R8G8B8A8_UNORM,0x10);
  synchronization::Image::Image
            (this_06,vk,device,local_1d0,(VkImageCreateInfo *)&local_198,(MemoryRequirement)0x0);
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._0_4_ = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_ = 0;
  if ((this_01->m_data).ptr != this_06) {
    de::details::
    UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
              (this_01);
    (this_01->m_data).ptr = this_06;
  }
  de::details::
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
            ((UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              *)&local_268);
  pauVar1 = (undefined1 (*) [12])((long)&pOVar4[0x21]._vptr_Operation + 4);
  local_1a8 = *(deUint32 *)((long)&pOVar4[0x23]._vptr_Operation + 4);
  local_1b8 = *(undefined8 *)*pauVar1;
  uStack_1b0 = *(undefined8 *)((long)&pOVar4[0x22]._vptr_Operation + 4);
  subresourceRange.baseArrayLayer = (int)((ulong)uStack_1b0 >> 0x20);
  subresourceRange._0_12_ = *pauVar1;
  subresourceRange.layerCount = local_1a8;
  makeImageView(&local_268,vk,device,(VkImage)*pOVar4[0x1a]._vptr_Operation,VK_IMAGE_VIEW_TYPE_2D,
                *(VkFormat *)&pOVar4[0x19]._vptr_Operation,subresourceRange);
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_198.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_198.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_1f0->_vptr_Operation != (_func_int **)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(pOVar4 + 0x1d),
               (VkImageView)local_1f0->_vptr_Operation);
  }
  local_1f0[2]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_1f0[3]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_1f0->_vptr_Operation = (_func_int **)local_198.m_renderSize.m_data;
  local_1f0[1]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  if (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImageView)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&local_268,vk,device,
                 *(VkFormat *)&pOVar4[0x19]._vptr_Operation);
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_198.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_198.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_210->_vptr_Operation != (_func_int **)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)(pOVar4 + 10),
               (VkRenderPass)local_210->_vptr_Operation);
  }
  local_210[2]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_210[3]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_210->_vptr_Operation = (_func_int **)local_198.m_renderSize.m_data;
  local_210[1]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  if (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)
               &local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkRenderPass)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&local_268,vk,device,
                  (VkRenderPass)pOVar4[9]._vptr_Operation,(VkImageView)pOVar4[0x1c]._vptr_Operation,
                  *(deUint32 *)&pOVar4[0x20]._vptr_Operation,
                  *(deUint32 *)((long)&pOVar4[0x20]._vptr_Operation + 4),1);
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_198.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_198.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_1f8->_vptr_Operation != (_func_int **)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(pOVar4 + 0xe),
               (VkFramebuffer)local_1f8->_vptr_Operation);
  }
  local_1f8[2]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_1f8[3]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_1f8->_vptr_Operation = (_func_int **)local_198.m_renderSize.m_data;
  local_1f8[1]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  if (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)
               &local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkFramebuffer)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&local_268,vk,device,
                     (VkDescriptorSetLayout)local_220->_vptr_Operation);
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)
             local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_198.m_renderSize.m_data[0] =
       (undefined4)local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_198.m_renderSize.m_data[1] =
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = (deUint64)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
  ;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_218->_vptr_Operation != (_func_int **)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(pOVar4 + 0x12),
               (VkPipelineLayout)local_218->_vptr_Operation);
  }
  local_218[2]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_218[3]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_218->_vptr_Operation = (_func_int **)local_198.m_renderSize.m_data;
  local_218[1]._vptr_Operation =
       (_func_int **)
       local_198.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  if (local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)
               &local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkPipelineLayout)
               local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  memset(&local_198,0,0xfc);
  local_198.m_patchControlPoints = 1;
  local_198.m_blendEnable = false;
  local_198.m_primitiveTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_198.m_renderSize.m_data = (int  [2])pOVar4[0x20]._vptr_Operation;
  format = ::vk::mapVkFormat(VK_FORMAT_R32G32B32A32_UINT);
  stride = tcu::getPixelSize(format);
  pGVar5 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                     (&local_198,VK_FORMAT_R32G32B32A32_UINT,stride);
  local_68.field_2._M_allocated_capacity = 0x65765f7475706e69;
  local_68.field_2._8_2_ = 0x7472;
  local_68._M_string_length = 10;
  local_68.field_2._M_local_buf[10] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)local_1e8->m_progCollection,&local_68);
  pGVar5 = GraphicsPipelineBuilder::setShader
                     (pGVar5,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                      *(ProgramBinary **)(cVar6._M_node + 2),(VkSpecializationInfo *)0x0);
  local_88.field_2._M_allocated_capacity = 0x72665f7475706e69;
  local_88.field_2._8_2_ = 0x6761;
  local_88._M_string_length = 10;
  local_88.field_2._M_local_buf[10] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)local_1e8->m_progCollection,&local_88);
  pGVar5 = GraphicsPipelineBuilder::setShader
                     (pGVar5,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,
                      *(ProgramBinary **)(cVar6._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            (&local_248,pGVar5,vk,device,(VkPipelineLayout)local_218->_vptr_Operation,
             (VkRenderPass)local_210->_vptr_Operation,local_1e8->m_pipelineCacheData);
  pOVar3 = local_1e0;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_1e0->_vptr_Operation != (_func_int **)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(pOVar4 + 0x16),
               (VkPipeline)local_1e0->_vptr_Operation);
  }
  pOVar3[2]._vptr_Operation =
       (_func_int **)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pOVar3[3]._vptr_Operation =
       (_func_int **)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pOVar3->_vptr_Operation =
       (_func_int **)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pOVar3[1]._vptr_Operation =
       (_func_int **)
       local_268.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  if (local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_198);
  (local_1c0->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = pOVar4;
  return local_1c0;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		return de::MovePtr<Operation>(new Implementation(context, resource));
	}